

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageManager.cpp
# Opt level: O0

void __thiscall PageManager::Store(PageManager *this)

{
  bool bVar1;
  reference ppcVar2;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> local_20;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> local_18;
  iterator i;
  PageManager *this_local;
  
  i._M_current = (char **)this;
  local_18._M_current = (char **)std::vector<char_*,_std::allocator<char_*>_>::begin(&this->pages);
  while( true ) {
    local_20._M_current = (char **)std::vector<char_*,_std::allocator<char_*>_>::end(&this->pages);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
              operator*(&local_18);
    std::ostream::write(&this->field_0x18,(long)*ppcVar2);
    __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::operator++
              (&local_18,0);
  }
  return;
}

Assistant:

void PageManager::Store() {

	for (vector<char *>::iterator i = pages.begin(); i != pages.end(); i++) {
		file.write(*i, page_size);
	}

}